

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void __thiscall ByteCodeGenerator::HomeArguments(ByteCodeGenerator *this,FuncInfo *funcInfo)

{
  ParseNode *this_00;
  anon_class_24_3_d3456051 fn;
  anon_class_16_2_85211fcd fn_00;
  bool bVar1;
  RegSlot RVar2;
  ParseNodeVar *pPVar3;
  anon_class_24_3_d3456051 loadFormal;
  ArgSlot pos;
  Symbol *sym;
  ParseNodePtr rest;
  anon_class_16_2_85211fcd addFormalsToPropertyIdContainer;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *this_local;
  
  addFormalsToPropertyIdContainer.funcInfo = funcInfo;
  bVar1 = ShouldTrackDebuggerMetadata(this);
  if (bVar1) {
    addFormalsToPropertyIdContainer.this =
         (ByteCodeGenerator *)addFormalsToPropertyIdContainer.funcInfo;
    fn_00.funcInfo = addFormalsToPropertyIdContainer.funcInfo;
    fn_00.this = this;
    MapFormals<ByteCodeGenerator::HomeArguments(FuncInfo*)::__0>
              ((addFormalsToPropertyIdContainer.funcInfo)->root,fn_00);
  }
  bVar1 = FuncInfo::GetHasArguments(addFormalsToPropertyIdContainer.funcInfo);
  if (bVar1) {
    this_00 = (addFormalsToPropertyIdContainer.funcInfo)->root->pnodeRest;
    if ((this_00 != (ParseNode *)0x0) && (bVar1 = ParseNode::IsVarLetOrConst(this_00), bVar1)) {
      pPVar3 = ParseNode::AsParseNodeVar(this_00);
      RVar2 = Symbol::GetLocation(pPVar3->sym);
      EmitLoadFormalIntoRegister(this,this_00,RVar2 + 1,addFormalsToPropertyIdContainer.funcInfo);
    }
  }
  else {
    loadFormal.funcInfo._6_2_ = 1;
    loadFormal.this = (ByteCodeGenerator *)((long)&loadFormal.funcInfo + 6);
    loadFormal.pos = (ArgSlot *)&addFormalsToPropertyIdContainer.funcInfo;
    fn.pos = (ArgSlot *)loadFormal.this;
    fn.this = this;
    fn.funcInfo = (FuncInfo **)loadFormal.pos;
    MapFormals<ByteCodeGenerator::HomeArguments(FuncInfo*)::__1>
              ((addFormalsToPropertyIdContainer.funcInfo)->root,fn);
  }
  return;
}

Assistant:

void ByteCodeGenerator::HomeArguments(FuncInfo *funcInfo)
{
    if (ShouldTrackDebuggerMetadata())
    {
        // Add formals to the debugger propertyidcontainer for reg slots
        auto addFormalsToPropertyIdContainer = [this, funcInfo](ParseNode *pnodeFormal)
        {
            if (pnodeFormal->IsVarLetOrConst())
            {
                Symbol* formal = pnodeFormal->AsParseNodeVar()->sym;
                if (!formal->IsInSlot(this, funcInfo))
                {
                    Assert(!formal->GetHasInit());
                    funcInfo->GetParsedFunctionBody()->InsertSymbolToRegSlotList(formal->GetName(), formal->GetLocation(), funcInfo->varRegsCount);
                }
            }
        };

        MapFormals(funcInfo->root, addFormalsToPropertyIdContainer);
    }

    // Transfer formal parameters to their home locations on the local frame.
    if (funcInfo->GetHasArguments())
    {
        ParseNodePtr rest = funcInfo->root->pnodeRest;
        if (rest != nullptr && rest->IsVarLetOrConst())
        {
            // Since we don't have to iterate over arguments here, we'll trust the location to be correct.
            Symbol* sym = rest->AsParseNodeVar()->sym;
            EmitLoadFormalIntoRegister(rest, sym->GetLocation() + 1, funcInfo);
        }

        // The arguments object creation helper does this work for us.
        return;
    }

    Js::ArgSlot pos = 1;
    auto loadFormal = [&](ParseNode *pnodeFormal)
    {
        EmitLoadFormalIntoRegister(pnodeFormal, pos, funcInfo);
        pos++;
    };
    MapFormals(funcInfo->root, loadFormal);
}